

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

char * __thiscall
Memory::Recycler::Realloc
          (Recycler *this,void *buffer,size_t existingBytes,size_t requestedBytes,bool truncate)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  char *pcVar4;
  size_t count;
  ulong uVar5;
  ulong uVar6;
  undefined8 *in_FS_OFFSET;
  
  if (requestedBytes == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1a1f,"(requestedBytes > 0)","requestedBytes > 0");
    if (!bVar3) goto LAB_00273876;
    *puVar1 = 0;
  }
  if (existingBytes == 0) {
    if (buffer != (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1a23,"(buffer == nullptr)","buffer == nullptr");
      if (!bVar3) goto LAB_00273876;
      *puVar1 = 0;
    }
    pcVar4 = AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>(this,requestedBytes);
    return pcVar4;
  }
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1a27,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) goto LAB_00273876;
    *puVar1 = 0;
  }
  uVar6 = requestedBytes + 0xf;
  if (0xfffffffffffffff0 < requestedBytes) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar5 = existingBytes + 0xf;
  if (0xfffffffffffffff0 < existingBytes) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar5 = uVar5 & 0xfffffffffffffff0;
  if (uVar5 < existingBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1a2d,"(nbytesExisting >= existingBytes)","nbytesExisting >= existingBytes"
                      );
    if (!bVar3) {
LAB_00273876:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  pcVar4 = (char *)buffer;
  if ((uVar6 & 0xfffffffffffffff0) != uVar5) {
    pcVar4 = AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>(this,requestedBytes);
    if (pcVar4 != (char *)0x0) {
      count = requestedBytes;
      if (existingBytes < requestedBytes) {
        count = existingBytes;
      }
      if (!truncate) {
        count = existingBytes;
      }
      js_memcpy_s(pcVar4,requestedBytes,buffer,count);
    }
    if (uVar5 != 0) {
      Free(this,buffer,uVar5);
    }
  }
  return pcVar4;
}

Assistant:

char *
Recycler::Realloc(void* buffer, DECLSPEC_GUARD_OVERFLOW size_t existingBytes, DECLSPEC_GUARD_OVERFLOW size_t requestedBytes, bool truncate)
{
    Assert(requestedBytes > 0);

    if (existingBytes == 0)
    {
        Assert(buffer == nullptr);
        return Alloc(requestedBytes);
    }

    Assert(buffer != nullptr);

    size_t nbytes = AllocSizeMath::Align(requestedBytes, HeapConstants::ObjectGranularity);

    // Since we successfully allocated, we shouldn't have integer overflow here
    size_t nbytesExisting = AllocSizeMath::Align(existingBytes, HeapConstants::ObjectGranularity);
    Assert(nbytesExisting >= existingBytes);

    if (nbytes == nbytesExisting)
    {
        return (char *)buffer;
    }

    char* replacementBuf = this->Alloc(requestedBytes);
    if (replacementBuf != nullptr)
    {
        // Truncate
        if (existingBytes > requestedBytes && truncate)
        {
            js_memcpy_s(replacementBuf, requestedBytes, buffer, requestedBytes);
        }
        else
        {
            js_memcpy_s(replacementBuf, requestedBytes, buffer, existingBytes);
        }
    }

    if (nbytesExisting > 0)
    {
        this->Free(buffer, nbytesExisting);
    }

    return replacementBuf;
}